

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Algorithm_Base.cpp
# Opt level: O0

StringSet * __thiscall
OSTEI_VRR_Algorithm_Base::GenerateVarReq_abi_cxx11_
          (OSTEI_VRR_Algorithm_Base *this,RRStepType rrstep)

{
  int in_EDX;
  StringSet *in_RDI;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar1;
  StringSet *req;
  undefined7 in_stack_fffffffffffffc68;
  undefined1 in_stack_fffffffffffffc6f;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffc70;
  allocator local_279;
  string local_278 [32];
  _Base_ptr local_258;
  undefined1 local_250;
  allocator local_241;
  string local_240 [32];
  _Base_ptr local_220;
  undefined1 local_218;
  allocator local_209;
  string local_208 [32];
  _Base_ptr local_1e8;
  undefined1 local_1e0;
  allocator local_1d1;
  string local_1d0 [32];
  _Base_ptr local_1b0;
  undefined1 local_1a8;
  allocator local_199;
  string local_198 [32];
  _Base_ptr local_178;
  undefined1 local_170;
  allocator local_161;
  string local_160 [32];
  _Base_ptr local_140;
  undefined1 local_138;
  allocator local_129;
  string local_128 [32];
  _Base_ptr local_108;
  undefined1 local_100;
  allocator local_f1;
  string local_f0 [32];
  _Base_ptr local_d0;
  undefined1 local_c8;
  allocator local_b9;
  string local_b8 [32];
  _Base_ptr local_98;
  undefined1 local_90;
  allocator local_81;
  string local_80 [32];
  _Base_ptr local_60;
  undefined1 local_58;
  allocator local_39;
  string local_38 [35];
  undefined1 local_15;
  int local_14;
  
  local_15 = 0;
  local_14 = in_EDX;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x121dfe);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"one_over_2pq",&local_39);
  pVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(in_stack_fffffffffffffc70,
                   (value_type *)CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68));
  local_60 = (_Base_ptr)pVar1.first._M_node;
  local_58 = pVar1.second;
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if ((local_14 == 0) || (local_14 == 1)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"a_over_p",&local_81);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(in_stack_fffffffffffffc70,
                     (value_type *)CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68));
    local_98 = (_Base_ptr)pVar1.first._M_node;
    local_90 = pVar1.second;
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"aop_PQ",&local_b9);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(in_stack_fffffffffffffc70,
                     (value_type *)CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68));
    local_d0 = (_Base_ptr)pVar1.first._M_node;
    local_c8 = pVar1.second;
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f0,"one_over_2p",&local_f1);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(in_stack_fffffffffffffc70,
                     (value_type *)CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68));
    local_108 = (_Base_ptr)pVar1.first._M_node;
    local_100 = pVar1.second;
    std::__cxx11::string::~string(local_f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_128,"a_over_q",&local_129);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(in_stack_fffffffffffffc70,
                     (value_type *)CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68));
    local_140 = (_Base_ptr)pVar1.first._M_node;
    local_138 = pVar1.second;
    std::__cxx11::string::~string(local_128);
    std::allocator<char>::~allocator((allocator<char> *)&local_129);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_160,"aoq_PQ",&local_161);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(in_stack_fffffffffffffc70,
                     (value_type *)CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68));
    local_178 = (_Base_ptr)pVar1.first._M_node;
    local_170 = pVar1.second;
    std::__cxx11::string::~string(local_160);
    std::allocator<char>::~allocator((allocator<char> *)&local_161);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_198,"one_over_2q",&local_199);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(in_stack_fffffffffffffc70,
                     (value_type *)CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68));
    local_1b0 = (_Base_ptr)pVar1.first._M_node;
    local_1a8 = pVar1.second;
    std::__cxx11::string::~string(local_198);
    std::allocator<char>::~allocator((allocator<char> *)&local_199);
  }
  switch(local_14) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d0,"P_PA",&local_1d1);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(in_stack_fffffffffffffc70,
                     (value_type *)CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68));
    local_1e8 = (_Base_ptr)pVar1.first._M_node;
    local_1e0 = pVar1.second;
    std::__cxx11::string::~string(local_1d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
    break;
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_208,"P_PB",&local_209);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(in_stack_fffffffffffffc70,
                     (value_type *)CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68));
    local_220 = (_Base_ptr)pVar1.first._M_node;
    local_218 = pVar1.second;
    std::__cxx11::string::~string(local_208);
    std::allocator<char>::~allocator((allocator<char> *)&local_209);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_240,"Q_PA",&local_241);
    pVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(in_stack_fffffffffffffc70,
                     (value_type *)CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68));
    local_258 = (_Base_ptr)pVar1.first._M_node;
    local_250 = pVar1.second;
    std::__cxx11::string::~string(local_240);
    std::allocator<char>::~allocator((allocator<char> *)&local_241);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_278,"Q_PB",&local_279);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(in_stack_fffffffffffffc70,
             (value_type *)CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68));
    std::__cxx11::string::~string(local_278);
    std::allocator<char>::~allocator((allocator<char> *)&local_279);
  }
  return in_RDI;
}

Assistant:

StringSet OSTEI_VRR_Algorithm_Base::GenerateVarReq(RRStepType rrstep) const
{
    StringSet req;

    req.insert("one_over_2pq");

    if(rrstep == RRStepType::I || rrstep == RRStepType::J)
    {
        req.insert("a_over_p");
        req.insert("aop_PQ");
        req.insert("one_over_2p");
    }
    else
    {
        req.insert("a_over_q");
        req.insert("aoq_PQ");
        req.insert("one_over_2q");
    }

    switch(rrstep)
    {
        case RRStepType::I:
            req.insert("P_PA");
            break;
        case RRStepType::J:
            req.insert("P_PB");
            break;
        case RRStepType::K:
            req.insert("Q_PA");
            break;
        case RRStepType::L:
            req.insert("Q_PB");
            break;
    }

    return req;
}